

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckSightOrRange
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *self;
  PClass *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  PClass *in_RAX;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  ulong uVar6;
  AActor *camera;
  char *pcVar7;
  long *plVar8;
  bool bVar9;
  double range;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = (AActor *)(param->field_0).field_1.a;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
        }
        in_RAX = (self->super_DThinker).super_DObject.Class;
        bVar9 = in_RAX != (PClass *)0x0;
        if (in_RAX != pPVar2 && bVar9) {
          do {
            in_RAX = in_RAX->ParentClass;
            bVar9 = in_RAX != (PClass *)0x0;
            if (in_RAX == pPVar2) break;
          } while (in_RAX != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d480e;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          pVVar1 = param + 1;
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_003d4647;
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_003d4647:
              iVar4 = param[2].field_0.i;
              plVar8 = &DAT_017e5fc8;
              range = (pVVar1->field_0).f * (pVVar1->field_0).f;
              uVar6 = 0;
              bVar9 = false;
              do {
                if (playeringame[uVar6] == true) {
                  bVar3 = DoCheckSightOrRange(self,(AActor *)plVar8[-0x2f],range,iVar4 != 0,true);
                  if (bVar3) {
                    if (numret < 1) {
LAB_003d4789:
                      iVar5 = 0;
                    }
                    else {
                      if (ret == (VMReturn *)0x0) {
                        __assert_fail("ret != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                      ,0xe12,
                                      "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
LAB_003d473f:
                      if (ret->RegType != '\0') goto LAB_003d4826;
                      *(undefined4 *)ret->Location = 0;
                      iVar5 = 1;
                    }
                    break;
                  }
                  in_RAX = (PClass *)*plVar8;
                  if (in_RAX != (PClass *)0x0) {
                    if (((in_RAX->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject.ObjectFlags &
                        0x20) == 0) {
                      in_RAX = (PClass *)*plVar8;
                      if (in_RAX[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase.super_DObject.ObjNext ==
                          (DObject *)0x0) {
                        camera = (AActor *)*plVar8;
                        if ((camera != (AActor *)0x0) &&
                           (((camera->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                          *plVar8 = 0;
                          camera = (AActor *)0x0;
                        }
                        bVar3 = DoCheckSightOrRange(self,camera,range,iVar4 != 0,true);
                        in_RAX = (PClass *)CONCAT71(extraout_var,bVar3);
                        if (bVar3) {
                          if (numret < 1) goto LAB_003d4789;
                          if (ret == (VMReturn *)0x0) {
                            __assert_fail("ret != NULL",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                          ,0xe18,
                                          "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                          goto LAB_003d473f;
                        }
                      }
                    }
                    else {
                      *plVar8 = 0;
                    }
                  }
                }
                iVar5 = (int)in_RAX;
                bVar9 = 6 < uVar6;
                uVar6 = uVar6 + 1;
                plVar8 = plVar8 + 0x54;
              } while (uVar6 != 8);
              if (bVar9) {
                if (numret < 1) {
                  iVar5 = 0;
                }
                else {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0xe1c,
                                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  if (ret->RegType != '\0') {
LAB_003d4826:
                    __assert_fail("RegType == REGT_INT",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                  ,0x13f,"void VMReturn::SetInt(int)");
                  }
                  *(undefined4 *)ret->Location = 1;
                  iVar5 = 1;
                }
              }
              return iVar5;
            }
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe08,
                        "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe07,
                    "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d480e:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe06,
                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSightOrRange)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(range);
	PARAM_BOOL_DEF(twodi);

	range *= range;
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			// Always check from each player.
			if (DoCheckSightOrRange(self, players[i].mo, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
			// If a player is viewing from a non-player, check that too.
			if (players[i].camera != NULL && players[i].camera->player == NULL &&
				DoCheckSightOrRange(self, players[i].camera, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
		}
	}
	ACTION_RETURN_BOOL(true);
}